

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureUnitCase::uploadCubeTexture
          (TextureUnitCase *this,int texNdx,Context *context)

{
  uint uVar1;
  uint uVar2;
  TextureCube *this_00;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  deUint32 err;
  reference pvVar8;
  reference ppTVar9;
  reference pvVar10;
  TextureFormat texFormat;
  TransferFormat TVar11;
  ConstPixelBufferAccess *pCVar12;
  void *pvVar13;
  int height;
  int width;
  ConstPixelBufferAccess access;
  int levelNdx;
  int face;
  deUint32 local_48;
  deUint32 dStack_44;
  TransferFormat formatGl;
  TextureCube *texture;
  int ndxCube;
  Context *context_local;
  int texNdx_local;
  TextureUnitCase *this_local;
  
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_ndxTexType,(long)texNdx);
  ppTVar9 = std::vector<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>::operator[]
                      (&this->m_texturesCube,(long)*pvVar8);
  this_00 = *ppTVar9;
  pvVar10 = std::
            vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
            ::operator[](&this->m_textureParams,(long)texNdx);
  texFormat = glu::mapGLInternalFormat(pvVar10->internalFormat);
  TVar11 = glu::getTransferFormat(texFormat);
  (*context->_vptr_Context[0xf])(context,0xcf5,1);
  for (access.m_data._4_4_ = CUBEFACE_NEGATIVE_X; (int)access.m_data._4_4_ < 6;
      access.m_data._4_4_ = access.m_data._4_4_ + CUBEFACE_POSITIVE_X) {
    for (access.m_data._0_4_ = 0; uVar1 = (uint)access.m_data,
        iVar5 = tcu::TextureCube::getNumLevels(this_00), (int)uVar1 < iVar5;
        access.m_data._0_4_ = (uint)access.m_data + 1) {
      bVar4 = tcu::TextureCube::isLevelEmpty(this_00,access.m_data._4_4_,(uint)access.m_data);
      if (!bVar4) {
        pCVar12 = tcu::TextureCube::getLevelFace(this_00,(uint)access.m_data,access.m_data._4_4_);
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&height,pCVar12);
        uVar6 = tcu::ConstPixelBufferAccess::getWidth((ConstPixelBufferAccess *)&height);
        uVar7 = tcu::ConstPixelBufferAccess::getHeight((ConstPixelBufferAccess *)&height);
        uVar3 = (uint)access.m_data;
        uVar1 = *(uint *)(s_cubeFaceTargets + (long)(int)access.m_data._4_4_ * 4);
        pvVar10 = std::
                  vector<deqp::gles3::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles3::Functional::TextureUnitCase::TextureParameters>_>
                  ::operator[](&this->m_textureParams,(long)texNdx);
        uVar2 = pvVar10->internalFormat;
        local_48 = TVar11.format;
        dStack_44 = TVar11.dataType;
        pvVar13 = tcu::ConstPixelBufferAccess::getDataPtr((ConstPixelBufferAccess *)&height);
        (*context->_vptr_Context[0x11])
                  (context,(ulong)uVar1,(ulong)uVar3,(ulong)uVar2,(ulong)uVar6,(ulong)uVar7,0,
                   local_48,dStack_44,pvVar13);
        err = (*context->_vptr_Context[0x79])();
        glu::checkError(err,"Set cube map image data",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureUnitTests.cpp"
                        ,0x44d);
      }
    }
  }
  return;
}

Assistant:

void TextureUnitCase::uploadCubeTexture (int texNdx, sglr::Context& context)
{
	int							ndxCube		= m_ndxTexType[texNdx];
	const tcu::TextureCube*		texture		= m_texturesCube[ndxCube];
	glu::TransferFormat			formatGl	= glu::getTransferFormat(glu::mapGLInternalFormat(m_textureParams[texNdx].internalFormat));

	context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	for (int face = 0; face < (int)tcu::CUBEFACE_LAST; face++)
	{
		for (int levelNdx = 0; levelNdx < texture->getNumLevels(); levelNdx++)
		{
			if (texture->isLevelEmpty((tcu::CubeFace)face, levelNdx))
				continue;

			tcu::ConstPixelBufferAccess		access	= texture->getLevelFace(levelNdx, (tcu::CubeFace)face);
			int								width	= access.getWidth();
			int								height	= access.getHeight();

			DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

			context.texImage2D(s_cubeFaceTargets[face], levelNdx, m_textureParams[texNdx].internalFormat, width, height, 0 /* border */, formatGl.format, formatGl.dataType, access.getDataPtr());
			GLU_EXPECT_NO_ERROR(context.getError(), "Set cube map image data");
		}
	}
}